

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O0

int vpx_rac_get(VpxRangeCoder *c)

{
  int iVar1;
  VpxRangeCoder *c_local;
  
  iVar1 = vpx_rac_get_prob(c,0x80);
  return iVar1;
}

Assistant:

int vpx_rac_get(VpxRangeCoder *c)
{
    return vpx_rac_get_prob(c, 128);
}